

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

int Bbl_ManFileSize(char *pFileName)

{
  FILE *__stream;
  long lVar1;
  int nFileSize;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Bbl_ManFileSize(): The file is unavailable (absent or open).\n");
    pFileName_local._4_4_ = 0;
  }
  else {
    fseek(__stream,0,2);
    lVar1 = ftell(__stream);
    pFileName_local._4_4_ = (int)lVar1;
    fclose(__stream);
  }
  return pFileName_local._4_4_;
}

Assistant:

int Bbl_ManFileSize( char * pFileName )
{
    FILE * pFile;
    int nFileSize;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Bbl_ManFileSize(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fseek( pFile, 0, SEEK_END );  
    nFileSize = ftell( pFile ); 
    fclose( pFile );
    return nFileSize;
}